

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

StmNode * __thiscall Canonicalizer::visit(Canonicalizer *this,CJUMP *node)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CJUMP *this_00;
  undefined4 extraout_var;
  StmNode *pSVar4;
  CJUMP *pCVar5;
  undefined4 extraout_var_00;
  ExprNode *pEVar6;
  undefined4 extraout_var_01;
  Temp *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  MOVE *this_02;
  TEMP *pTVar7;
  undefined4 extraout_var_07;
  SEQ *this_03;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  
  if ((&node->left->super_StmNode == (StmNode *)0x0) ||
     (iVar1 = StmNode::getTypeStm(&node->left->super_StmNode), iVar1 != 7)) {
    if ((&node->right->super_StmNode == (StmNode *)0x0) ||
       (iVar1 = StmNode::getTypeStm(&node->right->super_StmNode), iVar1 != 7)) {
      pEVar6 = node->left;
      if (pEVar6 != (ExprNode *)0x0) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[3])(pEVar6,this);
        CJUMP::setLeft(node,(ExprNode *)CONCAT44(extraout_var_05,iVar1));
      }
      pEVar6 = node->right;
      this_00 = node;
      if (pEVar6 != (ExprNode *)0x0) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[3])(pEVar6,this);
        CJUMP::setRight(node,(ExprNode *)CONCAT44(extraout_var_06,iVar1));
      }
    }
    else {
      this->changed = true;
      pEVar6 = node->right;
      this_01 = (Temp *)operator_new(0x10);
      Temp::Temp(this_01);
      iVar1 = StmNode::getTypeStm(&node->right->super_StmNode);
      this_00 = (CJUMP *)operator_new(0x20);
      if (iVar1 == 2) {
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
        pSVar4 = (StmNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x18))
                           ((long *)CONCAT44(extraout_var_02,iVar1),this);
        pCVar5 = (CJUMP *)operator_new(0x30);
        iVar1 = *(int *)&(node->super_StmNode).field_0xc;
        iVar2 = (*(node->left->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->left,this);
        iVar3 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
        pEVar6 = (ExprNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x18))
                           ((long *)CONCAT44(extraout_var_04,iVar3),this);
        CJUMP::CJUMP(pCVar5,iVar1,(ExprNode *)CONCAT44(extraout_var_03,iVar2),pEVar6,node->ifTrue,
                     node->ifFalse);
        SEQ::SEQ((SEQ *)this_00,pSVar4,(StmNode *)pCVar5);
      }
      else {
        this_02 = (MOVE *)operator_new(0x20);
        pTVar7 = (TEMP *)operator_new(0x18);
        TEMP::TEMP(pTVar7,this_01);
        iVar1 = (*(node->left->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->left,this);
        MOVE::MOVE(this_02,(ExprNode *)pTVar7,(ExprNode *)CONCAT44(extraout_var_07,iVar1));
        this_03 = (SEQ *)operator_new(0x20);
        iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
        pSVar4 = (StmNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar1) + 0x18))
                           ((long *)CONCAT44(extraout_var_08,iVar1),this);
        pCVar5 = (CJUMP *)operator_new(0x30);
        iVar1 = *(int *)&(node->super_StmNode).field_0xc;
        pTVar7 = (TEMP *)operator_new(0x18);
        TEMP::TEMP(pTVar7,this_01);
        iVar2 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
        pEVar6 = (ExprNode *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x18))
                           ((long *)CONCAT44(extraout_var_09,iVar2),this);
        CJUMP::CJUMP(pCVar5,iVar1,(ExprNode *)pTVar7,pEVar6,node->ifTrue,node->ifFalse);
        SEQ::SEQ(this_03,pSVar4,(StmNode *)pCVar5);
        SEQ::SEQ((SEQ *)this_00,(StmNode *)this_02,(StmNode *)this_03);
      }
    }
  }
  else {
    this->changed = true;
    pEVar6 = node->left;
    this_00 = (CJUMP *)operator_new(0x20);
    iVar1 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[4])(pEVar6);
    pSVar4 = (StmNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                       ((long *)CONCAT44(extraout_var,iVar1),this);
    pCVar5 = (CJUMP *)operator_new(0x30);
    iVar1 = *(int *)&(node->super_StmNode).field_0xc;
    iVar2 = (*(pEVar6->super_StmNode).super_ICTNode._vptr_ICTNode[5])(pEVar6);
    pEVar6 = (ExprNode *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                       ((long *)CONCAT44(extraout_var_00,iVar2),this);
    iVar2 = (*(node->right->super_StmNode).super_ICTNode._vptr_ICTNode[3])(node->right,this);
    CJUMP::CJUMP(pCVar5,iVar1,pEVar6,(ExprNode *)CONCAT44(extraout_var_01,iVar2),node->ifTrue,
                 node->ifFalse);
    SEQ::SEQ((SEQ *)this_00,pSVar4,(StmNode *)pCVar5);
  }
  return &this_00->super_StmNode;
}

Assistant:

StmNode *Canonicalizer::visit(CJUMP *node) {
    if (node->getLeft() && node->getLeft()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getLeft();
        return new SEQ(eseq->getS()->accept(this), new CJUMP(node->getRelop(),
                                                             eseq->getE()->accept(this), node->getRight()->accept(this),
                                                             node->getIfTrue(), node->getIfFalse()));
    }

    if (node->getRight() && node->getRight()->getTypeStm() == V_ESEQ) {
        changed = true;
        ExprNode *eseq = node->getRight();
        Temp *t = new Temp();

        if (node->getRight()->getTypeStm() == V_NAME) {
            return new SEQ(eseq->getS()->accept(this), new CJUMP(node->getRelop(),
                                                                 node->getLeft()->accept(this),
                                                                 eseq->getE()->accept(this),
                                                                 node->getIfTrue(), node->getIfFalse()));
        } else {
            return new SEQ(new MOVE(new TEMP(t), node->getLeft()->accept(this)),
                           new SEQ(eseq->getS()->accept(this), new CJUMP(node->getRelop(),
                                                                         new TEMP(t), eseq->getE()->accept(this),
                                                                         node->getIfTrue(), node->getIfFalse())));
        }
    } else {
        if (node->getLeft())node->setLeft(node->getLeft()->accept(this));
        if (node->getRight())node->setRight(node->getRight()->accept(this));
    }
    return node;
}